

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O2

void av1_tile_init(TileInfo *tile,AV1_COMMON *cm,int row,int col)

{
  av1_tile_set_row(tile,cm,row);
  av1_tile_set_col(tile,cm,col);
  return;
}

Assistant:

void av1_tile_init(TileInfo *tile, const AV1_COMMON *cm, int row, int col) {
  av1_tile_set_row(tile, cm, row);
  av1_tile_set_col(tile, cm, col);
}